

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O0

void __thiscall SDLInputJoystickManager::~SDLInputJoystickManager(SDLInputJoystickManager *this)

{
  uint uVar1;
  SDLInputJoystick **ppSVar2;
  uint local_14;
  uint i;
  SDLInputJoystickManager *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::Size(&this->Joysticks);
    if (uVar1 <= local_14) break;
    ppSVar2 = TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::operator[]
                        (&this->Joysticks,(ulong)local_14);
    if (*ppSVar2 != (SDLInputJoystick *)0x0) {
      (*((*ppSVar2)->super_IJoystickConfig)._vptr_IJoystickConfig[1])();
    }
    local_14 = local_14 + 1;
  }
  TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::~TArray(&this->Joysticks);
  return;
}

Assistant:

~SDLInputJoystickManager()
	{
		for(unsigned int i = 0;i < Joysticks.Size();i++)
			delete Joysticks[i];
	}